

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_crypto
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar crypto_op_code,uchar crypto_size,uchar *script,size_t script_len,
              size_t *write_len)

{
  ulong local_50;
  size_t check_len;
  size_t child_write_len;
  uchar *puStack_30;
  int ret;
  uchar *script_local;
  uchar crypto_size_local;
  uchar crypto_op_code_local;
  miniscript_node_t *pmStack_20;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  check_len = *write_len;
  if (script_len < 0x208) {
    local_50 = script_len;
  }
  else {
    local_50 = 0x208;
  }
  if (((node->child == (miniscript_node_t *)0x0) ||
      (script_len < (ulong)(long)(int)(crypto_size + 8))) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    puStack_30 = script;
    script_local._2_1_ = crypto_size;
    script_local._3_1_ = crypto_op_code;
    script_local._4_4_ = derive_child_num;
    pmStack_20 = parent;
    parent_local = node;
    node_local._4_4_ =
         generate_script_from_miniscript
                   (node->child,node,derive_child_num,script + 6,script_len - 8,&check_len);
    if (node_local._4_4_ == 0) {
      if (local_50 < check_len + 7) {
        node_local._4_4_ = -2;
      }
      else {
        *puStack_30 = 0x82;
        puStack_30[1] = '\x01';
        puStack_30[2] = ' ';
        puStack_30[3] = 0x88;
        puStack_30[4] = script_local._3_1_;
        puStack_30[5] = script_local._2_1_;
        puStack_30[check_len + 6] = 0x87;
        *write_len = check_len + 7;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_miniscript_crypto(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char crypto_op_code,
    unsigned char crypto_size,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ?
                       script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!node->child || (script_len < (size_t)(crypto_size + 8)) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num,
                                          &script[6], script_len - 8, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len + 7 > check_len)
        return WALLY_EINVAL;

    script[0] = OP_SIZE;
    script[1] = 0x01;
    script[2] = 0x20;
    script[3] = OP_EQUALVERIFY;
    script[4] = crypto_op_code;
    script[5] = crypto_size;
    script[child_write_len + 6] = OP_EQUAL;
    *write_len = child_write_len + 7;
    return ret;
}